

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall
soul::AST::StaticAssertion::StaticAssertion
          (StaticAssertion *this,Context *c,Expression *failureCondition,string *error)

{
  bool condition;
  ulong uVar1;
  Expression *e;
  string *error_local;
  Expression *failureCondition_local;
  Context *c_local;
  StaticAssertion *this_local;
  
  Expression::Expression(&this->super_Expression,StaticAssertion,c,unknown);
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__StaticAssertion_00586f30;
  pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Expression,void>
            (&this->condition,failureCondition);
  std::__cxx11::string::string((string *)&this->errorMessage,(string *)error);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    std::__cxx11::string::operator=((string *)&this->errorMessage,"static_assert failed");
  }
  e = pool_ref<soul::AST::Expression>::get(&this->condition);
  condition = isPossiblyValue(e);
  checkAssertion(condition,"isPossiblyValue (condition.get())","StaticAssertion",0xa38);
  return;
}

Assistant:

StaticAssertion (const Context& c, Expression& failureCondition, std::string error)
            : Expression (ObjectType::StaticAssertion, c, ExpressionKind::unknown),
              condition (failureCondition), errorMessage (std::move (error))
        {
            if (errorMessage.empty())
                errorMessage = "static_assert failed";

            SOUL_ASSERT (isPossiblyValue (condition.get()));
        }